

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O3

void Tools::deque_remove_element_at_index<PhyloTreeEdge>
               (deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *c,size_t index)

{
  ulong uVar1;
  ulong uVar2;
  iterator local_40;
  iterator local_20;
  
  local_20._M_cur =
       (c->super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_20._M_node =
       (c->super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
       super__Deque_impl_data._M_start._M_node;
  uVar1 = ((long)local_20._M_cur -
           (long)(c->super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_first >> 3) * -0x71c71c71c71c71c7 + index;
  if ((long)uVar1 < 0) {
    uVar2 = ~(~uVar1 / 7);
  }
  else {
    if (uVar1 < 7) {
      local_20._M_cur = local_20._M_cur + index;
      local_20._M_first = *local_20._M_node;
      goto LAB_001243bf;
    }
    uVar2 = uVar1 / 7;
  }
  local_20._M_node = local_20._M_node + uVar2;
  local_20._M_first = *local_20._M_node;
  local_20._M_cur = local_20._M_first + uVar2 * -7 + uVar1;
LAB_001243bf:
  local_20._M_last = local_20._M_first + 7;
  std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::_M_erase(&local_40,c,&local_20);
  return;
}

Assistant:

static void deque_remove_element_at_index(deque<T> &c, size_t index) {
        c.erase(c.begin() + index);
    }